

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_deep_copy(REF_GRID_conflict *ref_grid_ptr,REF_GRID original)

{
  uint uVar1;
  REF_GRID_conflict ref_mpi_ptr;
  long lVar2;
  
  ref_mpi_ptr = (REF_GRID_conflict)malloc(0x110);
  *ref_grid_ptr = ref_mpi_ptr;
  if (ref_mpi_ptr == (REF_GRID_conflict)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x50,
           "ref_grid_deep_copy","malloc *ref_grid_ptr of REF_GRID_STRUCT NULL");
    uVar1 = 2;
  }
  else {
    uVar1 = ref_mpi_deep_copy((REF_MPI *)ref_mpi_ptr,original->mpi);
    if (uVar1 == 0) {
      uVar1 = ref_node_deep_copy(&ref_mpi_ptr->node,ref_mpi_ptr->mpi,original->node);
      if (uVar1 == 0) {
        lVar2 = 0;
        do {
          uVar1 = ref_cell_deep_copy((REF_CELL *)((long)ref_mpi_ptr->cell + lVar2),
                                     *(REF_CELL *)((long)original->cell + lVar2));
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x5e,"ref_grid_deep_copy",(ulong)uVar1,"cell deep copy");
            return uVar1;
          }
          lVar2 = lVar2 + 8;
        } while (lVar2 != 0x80);
        ref_mpi_ptr->cell[0x10] = (REF_CELL)0x0;
        uVar1 = ref_geom_deep_copy(&ref_mpi_ptr->geom,original->geom);
        if (uVar1 == 0) {
          uVar1 = ref_gather_create(&ref_mpi_ptr->gather);
          if (uVar1 == 0) {
            uVar1 = ref_adapt_deep_copy(&ref_mpi_ptr->adapt,original->adapt);
            if (uVar1 == 0) {
              ref_mpi_ptr->interp = (REF_INTERP)0x0;
              ref_mpi_ptr->partitioner = original->partitioner;
              uVar1 = 0;
              ref_mpi_ptr->partitioner_seed = 0;
              ref_mpi_ptr->partitioner_full = original->partitioner_full;
              ref_mpi_ptr->meshb_version = 0;
              ref_mpi_ptr->coordinate_system = original->coordinate_system;
              ref_mpi_ptr->unit = original->unit;
              ref_mpi_ptr->references[0] = original->references[0];
              ref_mpi_ptr->references[1] = original->references[1];
              ref_mpi_ptr->references[2] = original->references[2];
              ref_mpi_ptr->references[3] = original->references[3];
              ref_mpi_ptr->references[4] = original->references[4];
              ref_mpi_ptr->references[5] = original->references[5];
              ref_mpi_ptr->references[6] = original->references[6];
              ref_mpi_ptr->twod = original->twod;
              ref_mpi_ptr->surf = original->surf;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x67,"ref_grid_deep_copy",(ulong)uVar1,"adapt deep copy");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x65,"ref_grid_deep_copy",(ulong)uVar1,"gather create");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 100,"ref_grid_deep_copy",(ulong)uVar1,"geom deep copy");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x59
               ,"ref_grid_deep_copy",(ulong)uVar1,"node deep copy");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x55,
             "ref_grid_deep_copy",(ulong)uVar1,"deep copy ref_mpi");
    }
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_deep_copy(REF_GRID *ref_grid_ptr,
                                      REF_GRID original) {
  REF_INT group;
  REF_GRID ref_grid;

  ref_malloc(*ref_grid_ptr, 1, REF_GRID_STRUCT);

  ref_grid = *ref_grid_ptr;

  RSS(ref_mpi_deep_copy(&ref_grid_mpi(ref_grid), ref_grid_mpi(original)),
      "deep copy ref_mpi");

  RSS(ref_node_deep_copy(&ref_grid_node(ref_grid), ref_grid_mpi(ref_grid),
                         ref_grid_node(original)),
      "node deep copy");

  for (group = 0; group < REF_CELL_N_TYPE; group++) {
    RSS(ref_cell_deep_copy(&ref_grid_cell(ref_grid, group),
                           ref_grid_cell(original, group)),
        "cell deep copy");
  }

  ref_grid_cell(ref_grid, REF_CELL_N_TYPE) = NULL;

  RSS(ref_geom_deep_copy(&ref_grid_geom(ref_grid), ref_grid_geom(original)),
      "geom deep copy");
  RSS(ref_gather_create(&ref_grid_gather(ref_grid)), "gather create");
  RSS(ref_adapt_deep_copy(&(ref_grid->adapt), original->adapt),
      "adapt deep copy");

  ref_grid_interp(ref_grid) = NULL;

  ref_grid_partitioner(ref_grid) = ref_grid_partitioner(original);
  ref_grid_partitioner_seed(ref_grid) = 0;
  ref_grid_partitioner_full(ref_grid) = ref_grid_partitioner_full(original);

  ref_grid_meshb_version(ref_grid) = 0;
  ref_grid_coordinate_system(ref_grid) = ref_grid_coordinate_system(original);
  ref_grid_unit(ref_grid) = ref_grid_unit(original);
  ref_grid_reference(ref_grid, 0) = ref_grid_reference(original, 0);
  ref_grid_reference(ref_grid, 1) = ref_grid_reference(original, 1);
  ref_grid_reference(ref_grid, 2) = ref_grid_reference(original, 2);
  ref_grid_reference(ref_grid, 3) = ref_grid_reference(original, 3);
  ref_grid_reference(ref_grid, 4) = ref_grid_reference(original, 4);
  ref_grid_reference(ref_grid, 5) = ref_grid_reference(original, 5);
  ref_grid_reference(ref_grid, 6) = ref_grid_reference(original, 6);

  ref_grid_twod(ref_grid) = ref_grid_twod(original);
  ref_grid_surf(ref_grid) = ref_grid_surf(original);

  return REF_SUCCESS;
}